

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ldmState_t *ls,
                 ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *dict,size_t dictSize,
                 ZSTD_dictContentType_e dictContentType,ZSTD_dictTableLoadMethod_e dtlm,
                 ZSTD_tableFillPurpose_e tfp,void *workspace)

{
  U32 UVar1;
  ZSTD_compressedBlockState_t *in_RDI;
  long in_R9;
  ZSTD_CCtx_params *unaff_retaddr;
  ZSTD_cwksp *in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined4 in_stack_00000018;
  undefined4 in_stack_0000001c;
  undefined4 in_stack_00000074;
  undefined4 in_stack_0000007c;
  ZSTD_cwksp *in_stack_00000088;
  ldmState_t *in_stack_00000090;
  ZSTD_matchState_t *in_stack_00000098;
  ZSTD_dictTableLoadMethod_e in_stack_000000b0;
  ZSTD_tableFillPurpose_e in_stack_000000b8;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  void *in_stack_fffffffffffffff8;
  size_t sVar2;
  
  if ((in_R9 == 0) || (in_stack_00000008 < (ZSTD_cwksp *)0x8)) {
    if (in_stack_00000010 == 2) {
      sVar2 = 0xffffffffffffffe0;
    }
    else {
      sVar2 = 0;
    }
  }
  else {
    ZSTD_reset_compressedBlockState(in_RDI);
    if (in_stack_00000010 == 1) {
      sVar2 = ZSTD_loadDictionaryContent
                        (in_stack_00000098,in_stack_00000090,in_stack_00000088,
                         (ZSTD_CCtx_params *)workspace,(void *)CONCAT44(in_stack_0000007c,tfp),
                         CONCAT44(in_stack_00000074,dtlm),in_stack_000000b0,in_stack_000000b8);
    }
    else {
      UVar1 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (UVar1 != 0xec30a437) {
        if (in_stack_00000010 == 0) {
          sVar2 = ZSTD_loadDictionaryContent
                            (in_stack_00000098,in_stack_00000090,in_stack_00000088,
                             (ZSTD_CCtx_params *)workspace,(void *)CONCAT44(in_stack_0000007c,tfp),
                             CONCAT44(in_stack_00000074,dtlm),in_stack_000000b0,in_stack_000000b8);
          return sVar2;
        }
        if (in_stack_00000010 == 2) {
          return 0xffffffffffffffe0;
        }
      }
      sVar2 = ZSTD_loadZstdDictionary
                        ((ZSTD_compressedBlockState_t *)
                         CONCAT44(in_stack_0000001c,in_stack_00000018),
                         (ZSTD_matchState_t *)CONCAT44(in_stack_00000014,in_stack_00000010),
                         in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,(size_t)in_RDI,
                         (ZSTD_dictTableLoadMethod_e)ws,(ZSTD_tableFillPurpose_e)ls,ms);
    }
  }
  return sVar2;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                               ldmState_t* ls,
                               ZSTD_cwksp* ws,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               ZSTD_tableFillPurpose_e tfp,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<8)) {
        RETURN_ERROR_IF(dictContentType == ZSTD_dct_fullDict, dictionary_wrong, "");
        return 0;
    }

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, ls, ws, params, dict, dictSize, dtlm, tfp);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(
                ms, ls, ws, params, dict, dictSize, dtlm, tfp);
        }
        RETURN_ERROR_IF(dictContentType == ZSTD_dct_fullDict, dictionary_wrong, "");
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(
        bs, ms, ws, params, dict, dictSize, dtlm, tfp, workspace);
}